

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall QGraphicsScenePrivate::enableMouseTrackingOnViews(QGraphicsScenePrivate *this)

{
  QGraphicsView **ppQVar1;
  long lVar2;
  QWidget *this_00;
  long lVar3;
  
  ppQVar1 = (this->views).d.ptr;
  lVar2 = (this->views).d.size;
  for (lVar3 = 0; lVar2 << 3 != lVar3; lVar3 = lVar3 + 8) {
    this_00 = QAbstractScrollArea::viewport(*(QAbstractScrollArea **)((long)ppQVar1 + lVar3));
    QWidget::setMouseTracking(this_00,true);
  }
  return;
}

Assistant:

const T *data() const noexcept { return ptr; }